

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::addrman_simple::test_method(addrman_simple *this)

{
  long lVar1;
  __single_object _Var2;
  bool bVar3;
  readonly_property<bool> rVar4;
  int32_t iVar5;
  int iVar6;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> _Var7;
  size_t sVar8;
  NodeContext *node_ctx;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  pointer __p;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  initializer_list<CAddress> __l_00;
  const_string file_05;
  const_string file_06;
  initializer_list<CAddress> __l_01;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  check_type cVar11;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0 [2];
  vector<CAddress,_std::allocator<CAddress>_> local_3a0;
  NodeSeconds local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char local_364 [4];
  size_t local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  __single_object addrman;
  undefined1 local_250 [8];
  vector<CAddress,_std::allocator<CAddress>_> vAddr;
  direct_or_indirect local_228;
  uint local_218;
  Network local_210;
  uint32_t uStack_20c;
  uint16_t local_208;
  CService addr2;
  direct_or_indirect local_1d8;
  uint local_1c8;
  Network local_1c0;
  uint32_t uStack_1bc;
  uint16_t local_1b8;
  CService addr1_dup;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_178;
  CAddress addr_ret1;
  direct_or_indirect local_128;
  uint local_118;
  Network local_110;
  uint32_t uStack_10c;
  uint16_t local_108;
  CService addr1;
  undefined **local_d8 [2];
  undefined1 *local_c8 [2];
  uint16_t local_b8;
  duration local_b0;
  ServiceFlags SStack_a8;
  CAddress addr_null;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node_ctx = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node;
  iVar5 = GetCheckRatio(node_ctx);
  _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   iVar5);
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"252.2.2.2","");
  ResolveIP(&source,(string *)local_d8);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],(ulong)((long)local_c8[0] + 1));
  }
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x48;
  file.m_begin = (iterator)&local_268;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_278,msg);
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cb0;
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x0,(optional<bool>)0x0);
  local_188._0_8_ = &local_3a0;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  addr1.super_CNetAddr.m_addr._union.direct[0] =
       vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data
       ._M_start == (pointer)0x0;
  addr1.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr1.super_CNetAddr.m_addr._size = 0;
  addr1.super_CNetAddr.m_addr._20_4_ = 0;
  addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x5f;
  local_c8[1] = (undefined1 *)&addr2;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013d3cf0;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  addr_null.super_CService.super_CNetAddr._24_8_ = local_188;
  addr_null.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_null.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3d30;
  addr_null.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr1,(lazy_ostream *)&addr_ret1,1,2,REQUIRE,0xe7eaf6,
             (size_t)&addr1_dup,0x48,(string *)local_d8,"0U",&addr_null);
  boost::detail::shared_count::~shared_count((shared_count *)&addr1.super_CNetAddr.m_addr._size);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_d8,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,(optional<Network>)0x0)
  ;
  addr_null.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_d8[1]._1_7_,local_d8[1]._0_1_);
  addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_d8[0];
  addr_null.super_CService.super_CNetAddr.m_addr._size = local_c8[0]._0_4_;
  addr_null.super_CService.super_CNetAddr._24_8_ = local_c8[1];
  addr_null.super_CService.port = local_b8;
  addr_null.nTime.__d.__r = (duration)(duration)local_b0.__r;
  addr_null.nServices = SStack_a8;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4a;
  file_00.m_begin = (iterator)&local_288;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_298,
             msg_00);
  addr1.super_CNetAddr.m_addr._union._8_8_ =
       addr1.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cb0;
  addr1.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CService::ToStringAddrPort_abi_cxx11_((string *)&addr1_dup,&addr_null.super_CService);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr1_dup
                     ,"[::]:0");
  addr2.super_CNetAddr.m_addr._union.direct[0] = iVar6 == 0;
  addr2.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr2.super_CNetAddr.m_addr._size = 0;
  addr2.super_CNetAddr.m_addr._20_4_ = 0;
  local_188._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_188._8_8_ = "";
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013d3d70;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe7eb23;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3db0;
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = &local_3a0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&addr1_dup;
  local_c8[1] = (undefined1 *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr2,(lazy_ostream *)&addr1,1,2,REQUIRE,0xe7eb06,
             (size_t)local_188,0x4a,
             (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_d8,"\"[::]:0\"",&addr_ret1);
  boost::detail::shared_count::~shared_count((shared_count *)&addr2.super_CNetAddr.m_addr._size);
  if ((size_type *)addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      &addr1_dup.super_CNetAddr.m_addr._size) {
    operator_delete(addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr1_dup.super_CNetAddr.m_addr._16_8_ + 1);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"250.1.1.1","");
  ResolveService(&addr1,(string *)local_d8,0x208d);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],(ulong)((long)local_c8[0] + 1));
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4e;
  file_01.m_begin = (iterator)&local_2a8;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2b8,
             msg_01);
  _Var2 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  local_110 = addr1.super_CNetAddr.m_net;
  uStack_10c = addr1.super_CNetAddr.m_scope_id;
  local_108 = addr1.port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents);
  local_c8[1] = (undefined1 *)_local_110;
  local_b8 = local_108;
  local_b0.__r = 100000000;
  SStack_a8 = NODE_NONE;
  __l._M_len = 1;
  __l._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2,__l,(allocator_type *)&vAddr);
  _cVar11 = 0x21bfe9;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&addr2,&source,(seconds)0x0);
  addr1_dup.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr1_dup.super_CNetAddr.m_addr._size = 0;
  addr1_dup.super_CNetAddr.m_addr._20_4_ = 0;
  local_188._0_8_ = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_188._8_8_ = "";
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3df0;
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = local_188;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2c0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr1_dup,(lazy_ostream *)&addr_ret1,1,0,WARN,_cVar11,
             (size_t)&local_2c8,0x4e);
  boost::detail::shared_count::~shared_count((shared_count *)&addr1_dup.super_CNetAddr.m_addr._size)
  ;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined1 **)0x0;
  }
  if (0x10 < local_118) {
    free(local_128.indirect_contents.indirect);
    local_128.indirect_contents.indirect = (char *)0x0;
  }
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4f;
  file_02.m_begin = (iterator)&local_2d8;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2e8,
             msg_02);
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ =
       addr1_dup.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cb0;
  addr1_dup.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1_dup.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b0[0] = (char *)AddrMan::Size((AddrMan *)
                                       addrman._M_t.
                                       super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                       .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                       (optional<Network>)0x0,(optional<bool>)0x0);
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_250;
  local_250._0_4_ = 1;
  addr2.super_CNetAddr.m_addr._union.direct[0] = local_3b0[0] == (char *)0x1;
  addr2.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr2.super_CNetAddr.m_addr._size = 0;
  addr2.super_CNetAddr.m_addr._20_4_ = 0;
  local_188._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_188._8_8_ = "";
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013d3cf0;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3d30;
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = &local_3a0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_3b0;
  local_c8[1] = (allocator_type *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr2,(lazy_ostream *)&addr1_dup,1,2,REQUIRE,0xe7eaf6,
             (size_t)local_188,0x4f,(iterator)local_d8,"1U",&addr_ret1);
  boost::detail::shared_count::~shared_count((shared_count *)&addr2.super_CNetAddr.m_addr._size);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_d8,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,(optional<Network>)0x0)
  ;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_d8[1]._1_7_,local_d8[1]._0_1_);
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_d8[0];
  addr_ret1.super_CService.super_CNetAddr.m_addr._size = local_c8[0]._0_4_;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = local_c8[1];
  addr_ret1.super_CService.port = local_b8;
  addr_ret1.nTime.__d.__r = (duration)(duration)local_b0.__r;
  addr_ret1.nServices = SStack_a8;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_2f8;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_308,
             msg_03);
  addr2.super_CNetAddr.m_addr._union._8_8_ =
       addr2.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cb0;
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr2.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CService::ToStringAddrPort_abi_cxx11_((string *)local_188,&addr_ret1.super_CService);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_188,"250.1.1.1:8333");
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,iVar6 == 0);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe7ea7d;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7eadc;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013d3d70;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_250 = (undefined1  [8])0xe7eb84;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ =
       addr1_dup.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3e30;
  addr1_dup.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1_dup.super_CNetAddr._24_8_ = local_250;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_3b0[0] = (char *)local_188;
  local_c8[1] = (undefined1 *)local_3b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr,(lazy_ostream *)&addr2,1,2,REQUIRE,0xe7eb67,
             (size_t)&local_3a0,0x51,
             (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_d8,"\"250.1.1.1:8333\"",&addr1_dup);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._0_8_ != &aStack_178) {
    operator_delete((void *)local_188._0_8_,aStack_178._M_allocated_capacity + 1);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"250.1.1.1","");
  ResolveService(&addr1_dup,(string *)local_d8,0x208d);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],(ulong)((long)local_c8[0] + 1));
  }
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x56;
  file_04.m_begin = (iterator)&local_318;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_328,
             msg_04);
  _Var2 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1d8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1_dup);
  local_1c0 = addr1_dup.super_CNetAddr.m_net;
  uStack_1bc = addr1_dup.super_CNetAddr.m_scope_id;
  local_1b8 = addr1_dup.port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1d8.indirect_contents);
  local_c8[1] = (undefined1 *)_local_1c0;
  local_b8 = local_1b8;
  local_b0.__r = 100000000;
  SStack_a8 = NODE_NONE;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&vAddr,__l_00,(allocator_type *)local_3b0);
  _cVar11 = 0x21c5be;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,&source,
                       (seconds)0x0);
  local_188[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  local_188._8_8_ = (element_type *)0x0;
  aStack_178._M_allocated_capacity = 0;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe7eba4;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7ebdb;
  addr2.super_CNetAddr.m_addr._union._8_8_ =
       addr2.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3df0;
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_330 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  addr2.super_CNetAddr._24_8_ = &local_3a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)&addr2,1,0,WARN,_cVar11,
             (size_t)&local_338,0x56);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_178._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined1 **)0x0;
  }
  if (0x10 < local_1c8) {
    free(local_1d8.indirect_contents.indirect);
    local_1d8.indirect_contents.indirect = (char *)0x0;
  }
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x57;
  file_05.m_begin = (iterator)&local_348;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_358,
             msg_05);
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013d3cb0;
  aStack_178._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_178._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_360 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_3b0[0] = (char *)&local_360;
  local_250 = (undefined1  [8])local_364;
  local_364[0] = '\x01';
  local_364[1] = '\0';
  local_364[2] = '\0';
  local_364[3] = '\0';
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,local_360 == 1);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe7ea7d;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7eadc;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013d3cf0;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  addr2.super_CNetAddr.m_addr._union._8_8_ =
       addr2.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3d30;
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr2.super_CNetAddr._24_8_ = local_250;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_c8[1] = (allocator_type *)local_3b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr,(lazy_ostream *)local_188,1,2,REQUIRE,0xe7eaf6,
             (size_t)&local_3a0,0x57,(iterator)local_d8,"1U",&addr2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"250.1.1.2","");
  ResolveService(&addr2,(string *)local_d8,0x208d);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],(ulong)((long)local_c8[0] + 1));
  }
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_370 = "";
  local_388.__d.__r = (duration)&boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x61;
  file_06.m_begin = (iterator)&local_378;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_388,
             msg_06);
  _Var2 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_228.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  local_210 = addr2.super_CNetAddr.m_net;
  uStack_20c = addr2.super_CNetAddr.m_scope_id;
  local_208 = addr2.port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_228.indirect_contents);
  local_c8[1] = (undefined1 *)_local_210;
  local_b8 = local_208;
  local_b0.__r = 100000000;
  SStack_a8 = NODE_NONE;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&local_3a0,__l_01,(allocator_type *)local_250);
  _cVar11 = 0x21c955;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_3a0,&source,
                       (seconds)0x0);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,bVar3);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3b0[0] = "addrman->Add({CAddress(addr2, NODE_NONE)}, source)";
  local_3b0[1] = (char *)((long)"addrman->Add({CAddress(addr2, NODE_NONE)}, source)" + 0x32);
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_178._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3b8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_178._8_8_ = (allocator_type *)local_3b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr,(lazy_ostream *)local_188,1,0,WARN,_cVar11,
             (size_t)&local_3c0,0x61);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_3a0);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined1 **)0x0;
  }
  if (0x10 < local_218) {
    free(local_228.indirect_contents.indirect);
    local_228.indirect_contents.indirect = (char *)0x0;
  }
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x62;
  file_07.m_begin = (iterator)&local_3d0;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3e0,
             msg_07);
  _cVar11 = 0x21ca80;
  sVar8 = AddrMan::Size((AddrMan *)
                        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                        (optional<bool>)0x0);
  local_188[0] = (class_property<bool>)(class_property<bool>)(sVar8 != 0);
  local_188._8_8_ = (element_type *)0x0;
  aStack_178._M_allocated_capacity = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1a0e10;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7ec2d;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013d3df0;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3e8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_c8[1] = (undefined1 *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_d8,1,0,WARN,_cVar11,
             (size_t)&local_3f0,0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_178._M_allocated_capacity);
  iVar5 = GetCheckRatio(node_ctx);
  _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   iVar5);
  _Var2 = addrman;
  local_d8[0] = (undefined **)0x0;
  bVar3 = (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)
          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
          super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)0x0;
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  if (bVar3) {
    AddrMan::~AddrMan((AddrMan *)
                      _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                      super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                      super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl);
    operator_delete((void *)_Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                            ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,8);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)local_d8);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = &aStack_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"250.1.1.3","");
  ResolveService((CService *)local_d8,(string *)local_188,0x208d);
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,std::allocator<CAddress>> *)&vAddr,(CService *)local_d8,
             (ServiceFlags *)&local_3a0);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined **)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._0_8_ != &aStack_178) {
    operator_delete((void *)local_188._0_8_,aStack_178._M_allocated_capacity + 1);
  }
  local_188._0_8_ = &aStack_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"250.1.1.4","");
  ResolveService((CService *)local_d8,(string *)local_188,0x208d);
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,std::allocator<CAddress>> *)&vAddr,(CService *)local_d8,
             (ServiceFlags *)&local_3a0);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined **)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._0_8_ != &aStack_178) {
    operator_delete((void *)local_188._0_8_,aStack_178._M_allocated_capacity + 1);
  }
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x69;
  file_08.m_begin = (iterator)&local_400;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_410,
             msg_08);
  _cVar11 = 0x21cd33;
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       AddrMan::Add((AddrMan *)
                    addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,&source,(seconds)0x0
                   );
  local_188._8_8_ = (element_type *)0x0;
  aStack_178._M_allocated_capacity = 0;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe7ec42;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7ec5d;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013d3df0;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_c8[1] = (undefined1 *)&local_3a0;
  local_188[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_d8,1,0,WARN,_cVar11,
             (size_t)&local_420,0x69);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_178._M_allocated_capacity);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x6a;
  file_09.m_begin = (iterator)&local_430;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_440,
             msg_09);
  _cVar11 = 0x21ce00;
  sVar8 = AddrMan::Size((AddrMan *)
                        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                        (optional<bool>)0x0);
  local_188[0] = (class_property<bool>)(class_property<bool>)(sVar8 != 0);
  local_188._8_8_ = (element_type *)0x0;
  aStack_178._M_allocated_capacity = 0;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe7ec19;
  local_3a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7ec2d;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013d3df0;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_448 = "";
  local_c8[1] = (undefined1 *)&local_3a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_d8,1,0,WARN,_cVar11,
             (size_t)&local_450,0x6a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_178._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  if (0x10 < addr2.super_CNetAddr.m_addr._size) {
    free(addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr1_dup.super_CNetAddr.m_addr._size) {
    free(addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr_ret1.super_CService.super_CNetAddr.m_addr._size) {
    free(addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr1.super_CNetAddr.m_addr._size) {
    free(addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr_null.super_CService.super_CNetAddr.m_addr._size) {
    free(addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < source.m_addr._size) {
    free(source.m_addr._union.indirect_contents.indirect);
    source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_simple)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    // Test: Does Addrman respond correctly when empty.
    BOOST_CHECK_EQUAL(addrman->Size(), 0U);
    auto addr_null = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_null.ToStringAddrPort(), "[::]:0");

    // Test: Does Addrman::Add work as expected.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    auto addr_ret1 = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_ret1.ToStringAddrPort(), "250.1.1.1:8333");

    // Test: Does IP address deduplication work correctly.
    //  Expected dup IP should not be added.
    CService addr1_dup = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(!addrman->Add({CAddress(addr1_dup, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);


    // Test: New table has one addr and we add a diff addr we should
    //  have at least one addr.
    // Note that addrman's size cannot be tested reliably after insertion, as
    // hash collisions may occur. But we can always be sure of at least one
    // success.

    CService addr2 = ResolveService("250.1.1.2", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK(addrman->Size() >= 1);

    // Test: reset addrman and test AddrMan::Add multiple addresses works as expected
    addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    std::vector<CAddress> vAddr;
    vAddr.emplace_back(ResolveService("250.1.1.3", 8333), NODE_NONE);
    vAddr.emplace_back(ResolveService("250.1.1.4", 8333), NODE_NONE);
    BOOST_CHECK(addrman->Add(vAddr, source));
    BOOST_CHECK(addrman->Size() >= 1);
}